

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

void vkt::ssbo::anon_unknown_15::initRefDataStorage
               (ShaderInterface *interface,BufferLayout *layout,RefDataStorage *storage)

{
  int bufferSize_00;
  bool bVar1;
  reference piVar2;
  vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *this;
  size_type sVar3;
  const_reference blockLayout_00;
  const_reference pvVar4;
  reference pvVar5;
  BlockDataPtr BVar6;
  reference local_98;
  int bufferSize;
  BlockLayoutEntry *blockLayout;
  int blockNdx;
  int curOffset;
  deUint8 *basePtr;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  const_iterator sizeIter;
  undefined1 local_38 [4];
  int totalSize;
  vector<int,_std::allocator<int>_> bufferSizes;
  RefDataStorage *storage_local;
  BufferLayout *layout_local;
  ShaderInterface *interface_local;
  
  bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)storage;
  computeBufferSizes((vector<int,_std::allocator<int>_> *)local_38,interface,layout);
  sizeIter._M_current._4_4_ = 0;
  local_48._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_38);
  while( true ) {
    local_50._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_38);
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_48);
    sizeIter._M_current._4_4_ = *piVar2 + sizeIter._M_current._4_4_;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_48);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(long)sizeIter._M_current._4_4_);
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    local_98 = (reference)0x0;
  }
  else {
    local_98 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
  }
  blockLayout._4_4_ = 0;
  this = (vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)
         (bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage + 6);
  sVar3 = std::vector<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>::
          size(&layout->blocks);
  std::vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>::resize(this,sVar3)
  ;
  blockLayout._0_4_ = 0;
  while( true ) {
    sVar3 = std::vector<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>::
            size(&layout->blocks);
    if ((int)sVar3 <= (int)blockLayout) break;
    blockLayout_00 =
         std::vector<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>::
         operator[](&layout->blocks,(long)(int)blockLayout);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,(long)(int)blockLayout);
    bufferSize_00 = *pvVar4;
    BVar6 = getBlockDataPtr(layout,blockLayout_00,local_98 + blockLayout._4_4_,bufferSize_00);
    pvVar5 = std::vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>::
             operator[]((vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *
                        )(bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 6),(long)(int)blockLayout);
    pvVar5->ptr = BVar6.ptr;
    pvVar5->size = BVar6.size;
    pvVar5->lastUnsizedArraySize = BVar6.lastUnsizedArraySize;
    blockLayout._4_4_ = bufferSize_00 + blockLayout._4_4_;
    blockLayout._0_4_ = (int)blockLayout + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return;
}

Assistant:

void initRefDataStorage (const ShaderInterface& interface, const BufferLayout& layout, RefDataStorage& storage)
{
	DE_ASSERT(storage.data.empty() && storage.pointers.empty());

	const vector<int>	bufferSizes = computeBufferSizes(interface, layout);
	int					totalSize	= 0;

	for (vector<int>::const_iterator sizeIter = bufferSizes.begin(); sizeIter != bufferSizes.end(); ++sizeIter)
		totalSize += *sizeIter;

	storage.data.resize(totalSize);

	// Pointers for each block.
	{
		deUint8*	basePtr		= storage.data.empty() ? DE_NULL : &storage.data[0];
		int			curOffset	= 0;

		DE_ASSERT(bufferSizes.size() == layout.blocks.size());
		DE_ASSERT(totalSize == 0 || basePtr);

		storage.pointers.resize(layout.blocks.size());

		for (int blockNdx = 0; blockNdx < (int)layout.blocks.size(); blockNdx++)
		{
			const BlockLayoutEntry&	blockLayout		= layout.blocks[blockNdx];
			const int				bufferSize		= bufferSizes[blockNdx];

			storage.pointers[blockNdx] = getBlockDataPtr(layout, blockLayout, basePtr + curOffset, bufferSize);

			curOffset += bufferSize;
		}
	}
}